

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake.cpp
# Opt level: O2

QString * __thiscall
UnixMakefileGenerator::defaultInstall
          (QString *__return_storage_ptr__,UnixMakefileGenerator *this,QString *t)

{
  QMakeProject *pQVar1;
  QString file_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined4 off;
  bool bVar5;
  char cVar6;
  QList<ProString> *this_00;
  ProStringList *pPVar7;
  ulong uVar8;
  QList<ProString> *pQVar9;
  iterator this_01;
  iterator iVar10;
  pointer pPVar11;
  qsizetype qVar12;
  long lVar13;
  QString *pQVar14;
  char cVar15;
  char *str;
  int i;
  UnixMakefileGenerator *pUVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  undefined7 in_stack_fffffffffffffcd8;
  UnixMakefileGenerator *pUVar18;
  QString *pQVar19;
  QArrayDataPointer<char16_t> local_2e0;
  QArrayDataPointer<char16_t> local_2c8;
  undefined1 local_2a8 [32];
  QArrayDataPointer<char16_t> local_288;
  ProString file;
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  QArrayDataPointer<ProString> local_1b8;
  undefined1 local_198 [32];
  QArrayDataPointer<char16_t> local_178;
  QArrayDataPointer<char16_t> local_158;
  undefined1 local_138 [48];
  undefined1 local_108 [64];
  undefined1 local_c8 [48];
  QString *local_98;
  char (*local_90) [2];
  undefined1 local_88 [8];
  undefined1 auStack_80 [48];
  QString *local_50;
  QString *local_48;
  char *local_38;
  
  local_38 = *(char **)(in_FS_OFFSET + 0x28);
  local_108._0_8_ = "target";
  bVar5 = operator!=(t,(char **)local_108);
  if (!bVar5) {
    pQVar1 = (this->super_MakefileGenerator).project;
    ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
    QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
    bVar5 = ProString::operator==((ProString *)local_88,"subdirs");
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
    if (!bVar5) {
      pQVar1 = (this->super_MakefileGenerator).project;
      pQVar14 = __return_storage_ptr__;
      ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
      QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
      cVar6 = ProString::operator==((ProString *)local_88,"aux");
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
      local_158.size = -0x5555555555555556;
      local_158.d._0_4_ = 0xaaaaaaaa;
      local_158.d._4_4_ = 0xaaaaaaaa;
      local_158.ptr._0_4_ = 0xaaaaaaaa;
      local_158.ptr._4_4_ = 0xaaaaaaaa;
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0x13])
                (&local_158,this);
      pQVar1 = (this->super_MakefileGenerator).project;
      local_c8._8_8_ = ".uninstall";
      local_c8._0_8_ = t;
      ProString::ProString<QString_const&,char_const(&)[11]>
                ((ProString *)local_88,
                 (QStringBuilder<const_QString_&,_const_char_(&)[11]> *)local_c8);
      this_00 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88)->
                 super_QList<ProString>;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      local_178.size = -0x5555555555555556;
      local_178.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_178.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_c8,"DESTDIR");
      QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
      ProString::toQString((QString *)&local_178,(ProString *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
      if (local_178.size != 0) {
        QString::right((QString *)local_88,(QString *)&local_178,1);
        bVar5 = operator!=((QString *)local_88,&Option::dir_sep);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        if (bVar5) {
          QString::append((QString *)&local_178);
        }
      }
      local_198._16_8_ = -0x5555555555555556;
      local_198._0_8_ = (Data *)0xaaaaaaaaaaaaaaaa;
      local_198._8_8_ = (char16_t *)0xaaaaaaaaaaaaaaaa;
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_c8,"target.path");
      QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
      ProString::toQString((QString *)local_108,(ProString *)local_88);
      MakefileGenerator::fileFixify
                ((QString *)local_198,&this->super_MakefileGenerator,(QString *)local_108,
                 (FileFixifyTypes)0x4,true);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_108);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
      QString::right((QString *)local_88,(QString *)local_198,1);
      bVar5 = operator!=((QString *)local_88,&Option::dir_sep);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      if (bVar5) {
        QString::append((QString *)local_198);
      }
      local_1b8.size = 0;
      local_1b8.d = (Data *)0x0;
      local_1b8.ptr = (ProString *)0x0;
      local_1d8._16_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_1d8._0_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_1d8._8_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
      QString::QString((QString *)local_1d8,"$(TARGET)");
      pQVar1 = (this->super_MakefileGenerator).project;
      local_c8._8_8_ = ".targets";
      local_c8._0_8_ = t;
      ProString::ProString<QString_const&,char_const(&)[9]>
                ((ProString *)local_88,
                 (QStringBuilder<const_QString_&,_const_char_(&)[9]> *)local_c8);
      pPVar7 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      pQVar1 = (this->super_MakefileGenerator).project;
      ProKey::ProKey((ProKey *)local_88,"QMAKE_BUNDLE");
      bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      if (bVar5) {
        pQVar1 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
        bVar5 = ProString::operator==((ProString *)local_88,"app");
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        if (bVar5) {
          QString::operator=((QString *)local_1d8,"$(QMAKE_TARGET)");
          cVar15 = '\0';
        }
        else {
          pQVar1 = (this->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
          QMakeEvaluator::first
                    ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
          bVar5 = ProString::operator==((ProString *)local_88,"lib");
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
          cVar15 = '\0';
          if (bVar5) {
            pQVar1 = (this->super_MakefileGenerator).project;
            QString::QString((QString *)local_88,"staticlib");
            bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_88,false);
            if (!bVar5) {
              pQVar1 = (this->super_MakefileGenerator).project;
              QString::QString((QString *)local_c8,"plugin");
              cVar15 = '\0';
              bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_c8,false);
              if (!bVar5) {
                pQVar1 = (this->super_MakefileGenerator).project;
                QString::QString((QString *)local_108,"unversioned_libname");
                bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_108,false);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_108);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_c8);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_88);
                if (!bVar5) {
                  pQVar1 = (this->super_MakefileGenerator).project;
                  ProKey::ProKey((ProKey *)local_88,"QMAKE_HPUX_SHLIB");
                  bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_88);
                  if (bVar5) {
                    ProString::ProString((ProString *)local_88,"$(TARGET0)");
                    QList<ProString>::emplaceBack<ProString_const&>
                              ((QList<ProString> *)&local_1b8,(ProString *)local_88);
                    ProString::ProString((ProString *)local_c8,"$(TARGET1)");
                    QList<ProString>::emplaceBack<ProString_const&>
                              ((QList<ProString> *)&local_1b8,(ProString *)local_c8);
                    ProString::ProString((ProString *)local_108,"$(TARGET2)");
                    QList<ProString>::emplaceBack<ProString_const&>
                              ((QList<ProString> *)&local_1b8,(ProString *)local_108);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)local_108);
                    QArrayDataPointer<char16_t>::~QArrayDataPointer
                              ((QArrayDataPointer<char16_t> *)local_c8);
                  }
                  else {
                    ProString::ProString((ProString *)local_88,"$(TARGET0)");
                    QList<ProString>::emplaceBack<ProString_const&>
                              ((QList<ProString> *)&local_1b8,(ProString *)local_88);
                  }
                  goto LAB_0017af27;
                }
                goto LAB_0017af2c;
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_c8);
            }
            cVar15 = '\0';
            goto LAB_0017af27;
          }
        }
      }
      else {
        pQVar1 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_c8,"QMAKE_BUNDLE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
        ProString::toQString((QString *)local_108,(ProString *)local_88);
        uVar4 = local_1d8._16_8_;
        uVar3 = local_1d8._8_8_;
        uVar2 = local_1d8._0_8_;
        local_1d8._0_8_ = local_108._0_8_;
        local_1d8._8_8_ = local_108._8_8_;
        local_108._0_8_ = uVar2;
        local_108._8_8_ = uVar3;
        local_1d8._16_8_ = local_108._16_8_;
        local_108._16_8_ = uVar4;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_108);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        pQVar1 = (this->super_MakefileGenerator).project;
        QString::QString((QString *)local_88,"sliced_bundle");
        bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_88,false);
        cVar15 = bVar5 + '\x01';
LAB_0017af27:
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      }
LAB_0017af2c:
      lVar13 = 0;
      for (uVar8 = 0; uVar8 < (ulong)(pPVar7->super_QList<ProString>).d.size; uVar8 = uVar8 + 1) {
        file.m_string.d.size = -0x5555555555555556;
        file.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
        file.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
        ProString::toQString
                  (&file.m_string,
                   (ProString *)
                   ((long)&(((pPVar7->super_QList<ProString>).d.ptr)->m_string).d.d + lVar13));
        local_138._16_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_138._0_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
        local_138._8_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
        QString::section((QString *)local_2a8,&file.m_string,(QChar)0x2f,-1,-1,(SectionFlags)0x0);
        auStack_80._16_8_ = local_2a8._16_8_;
        auStack_80._8_8_ = local_2a8._8_8_;
        auStack_80._0_8_ = local_2a8._0_8_;
        local_88 = (undefined1  [8])local_198;
        local_2a8._0_8_ = (ProString *)0x0;
        local_2a8._8_8_ = (ProString *)0x0;
        local_2a8._16_8_ = (char16_t *)0x0;
        QStringBuilder<QString_&,_QString>::convertTo<QString>
                  ((QString *)local_108,(QStringBuilder<QString_&,_QString> *)local_88);
        pUVar16 = this;
        MakefileGenerator::filePrefixRoot
                  ((QString *)local_c8,&this->super_MakefileGenerator,(QString *)&local_158,
                   (QString *)local_108);
        (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                  (local_138,this,(QArrayDataPointer<char16_t> *)local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_108);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_80);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_2a8);
        this = pUVar16;
        pQVar19 = pQVar14;
        if ((pQVar14->d).size != 0) {
          QString::operator+=(pQVar14,"\n\t");
          this = pUVar16;
        }
        Option::fixPathToTargetOS((QString *)local_1f8,&file.m_string,false,true);
        (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                  ((QArrayDataPointer<char16_t> *)local_2a8,this,
                   (QArrayDataPointer<char16_t> *)local_1f8);
        local_108._24_8_ = local_2a8._16_8_;
        local_108._16_8_ = local_2a8._8_8_;
        local_108._8_8_ = local_2a8._0_8_;
        local_108._0_8_ = "$(QINSTALL) ";
        local_2a8._0_8_ = (ProString *)0x0;
        local_2a8._8_8_ = (ProString *)0x0;
        local_2a8._16_8_ = (ProString *)0x0;
        QStringBuilder<const_char_(&)[13],_QString>::QStringBuilder
                  ((QStringBuilder<const_char_(&)[13],_QString> *)local_c8,
                   (QStringBuilder<const_char_(&)[13],_QString> *)local_108);
        local_c8[0x20] = 0x20;
        QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char>::QStringBuilder
                  ((QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char> *)local_88,
                   (QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char> *)local_c8);
        auStack_80._32_8_ = local_138;
        ::operator+=(pQVar14,(QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString>,_char>,_QString_&>
                              *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_80);
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)(local_c8 + 8));
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)(local_108 + 8));
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_2a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1f8);
        pQVar14 = pQVar19;
        if ((this_00->d).size != 0) {
          ProString::ProString((ProString *)local_88,"\n\t");
          QList<ProString>::emplaceBack<ProString>(this_00,(ProString *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          pQVar14 = pQVar19;
        }
        local_c8._0_8_ = "-$(DEL_FILE) ";
        local_c8._8_8_ = (ProString *)local_138;
        ProString::ProString<char_const(&)[14],QString&>
                  ((ProString *)local_88,(QStringBuilder<const_char_(&)[14],_QString_&> *)local_c8);
        QList<ProString>::emplaceBack<ProString>(this_00,(ProString *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_138);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&file);
        lVar13 = lVar13 + 0x30;
      }
      local_1f8._0_8_ = local_1d8._0_8_;
      local_1f8._8_8_ = local_1d8._8_8_;
      local_1f8._16_8_ = local_1d8._16_8_;
      if ((ProString *)local_1d8._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_1d8._0_8_)->d).d =
             *(int *)&(((QString *)local_1d8._0_8_)->d).d + 1;
        UNLOCK();
      }
      pUVar16 = this;
      if (local_178.size != 0) {
        local_108._0_8_ = &local_178;
        local_108._8_8_ = (ProString *)local_1d8;
        QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                  ((QString *)local_c8,(QStringBuilder<QString_&,_QString_&> *)local_108);
        Option::fixPathToTargetOS((QString *)local_88,(QString *)local_c8,false,true);
        uVar4 = local_1f8._16_8_;
        uVar3 = local_1f8._8_8_;
        uVar2 = local_1f8._0_8_;
        local_1f8._0_8_ = local_88;
        local_1f8._8_8_ = auStack_80._0_8_;
        local_88 = (undefined1  [8])uVar2;
        auStack_80._0_8_ = uVar3;
        local_1f8._16_8_ = auStack_80._8_8_;
        auStack_80._8_8_ = uVar4;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
      }
      local_218._16_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_218._0_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_218._8_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
      local_108._0_8_ = local_198;
      local_108._8_8_ = (ProString *)local_1d8;
      QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                ((QString *)local_c8,(QStringBuilder<QString_&,_QString_&> *)local_108);
      MakefileGenerator::fileFixify
                ((QString *)local_88,&this->super_MakefileGenerator,(QString *)local_c8,
                 (FileFixifyTypes)0x4,true);
      MakefileGenerator::filePrefixRoot
                ((QString *)local_218,&this->super_MakefileGenerator,(QString *)&local_158,
                 (QString *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
      local_238._0_8_ = local_218._0_8_;
      local_238._8_8_ = local_218._8_8_;
      local_238._16_8_ = local_218._16_8_;
      if ((ProString *)local_218._0_8_ != (ProString *)0x0) {
        LOCK();
        *(int *)&(((QString *)local_218._0_8_)->d).d =
             *(int *)&(((QString *)local_218._0_8_)->d).d + 1;
        UNLOCK();
      }
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                ((QArrayDataPointer<char16_t> *)local_88,this,local_218);
      uVar4 = local_218._16_8_;
      uVar3 = local_218._8_8_;
      uVar2 = local_218._0_8_;
      local_218._0_8_ = local_88;
      local_218._8_8_ = auStack_80._0_8_;
      local_88 = (undefined1  [8])uVar2;
      auStack_80._0_8_ = uVar3;
      local_218._16_8_ = auStack_80._8_8_;
      auStack_80._8_8_ = uVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      if (cVar15 != '\0') {
        local_138._0_8_ = (ProString *)0x0;
        local_138._8_8_ = (ProString *)0x0;
        local_138._16_8_ = (ProString *)0x0;
        pQVar1 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
        bVar5 = ProString::operator==((ProString *)local_88,"lib");
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        if (bVar5) {
          pQVar1 = (this->super_MakefileGenerator).project;
          QString::QString((QString *)local_88,"shallow_bundle");
          bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_88,false);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          if (!bVar5) {
            pQVar1 = (this->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)local_108,"QMAKE_FRAMEWORK_VERSION");
            QMakeEvaluator::first
                      ((ProString *)local_c8,&pQVar1->super_QMakeEvaluator,(ProKey *)local_108);
            local_88 = (undefined1  [8])0x21c51c;
            ProString::ProString((ProString *)auStack_80,(ProString *)local_c8);
            ::operator+=((QString *)local_138,
                         (QStringBuilder<const_char_(&)[11],_ProString> *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)auStack_80);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_108);
          }
          QString::operator+=((QString *)local_138,"/$(TARGET)");
        }
        else {
          pQVar1 = (this->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)&file,"QMAKE_BUNDLE_LOCATION");
          QMakeEvaluator::first
                    ((ProString *)local_108,&pQVar1->super_QMakeEvaluator,(ProKey *)&file);
          local_c8._0_8_ = "/";
          ProString::ProString((ProString *)(local_c8 + 8),(ProString *)local_108);
          QStringBuilder<const_char_(&)[2],_ProString>::QStringBuilder
                    ((QStringBuilder<const_char_(&)[2],_ProString> *)local_88,
                     (QStringBuilder<const_char_(&)[2],_ProString> *)local_c8);
          local_50 = (QString *)0x21c532;
          this = pUVar16;
          QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString>,_const_char_(&)[17]>::
          convertTo<QString>((QString *)local_2a8,
                             (QStringBuilder<QStringBuilder<const_char_(&)[2],_ProString>,_const_char_(&)[17]>
                              *)local_88);
          uVar4 = local_138._16_8_;
          uVar3 = local_138._8_8_;
          uVar2 = local_138._0_8_;
          local_138._0_8_ = local_2a8._0_8_;
          local_138._8_8_ = local_2a8._8_8_;
          local_2a8._0_8_ = uVar2;
          local_2a8._8_8_ = uVar3;
          local_138._16_8_ = local_2a8._16_8_;
          local_2a8._16_8_ = uVar4;
          pUVar16 = this;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_2a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_80)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)(local_c8 + 8));
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_108);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&file);
        }
        QString::append((QString *)local_238);
        if (cVar15 == '\x01') {
          pQVar19 = pQVar14;
          if ((pQVar14->d).size != 0) {
            QString::operator+=(pQVar14,"\n\t");
          }
          local_88 = (undefined1  [8])0x21d4ef;
          auStack_80._0_8_ = local_218;
          auStack_80._8_8_ = "\n\t";
          ::operator+=(pQVar14,(QStringBuilder<QStringBuilder<const_char_(&)[16],_QString_&>,_const_char_(&)[3]>
                                *)local_88);
          pQVar14 = pQVar19;
        }
        else {
          QString::append((QString *)local_1f8);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_138);
      }
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                ((QArrayDataPointer<char16_t> *)local_88,this,(ProString *)local_1f8);
      uVar4 = local_1f8._16_8_;
      uVar3 = local_1f8._8_8_;
      uVar2 = local_1f8._0_8_;
      local_1f8._0_8_ = local_88;
      local_1f8._8_8_ = auStack_80._0_8_;
      local_88 = (undefined1  [8])uVar2;
      auStack_80._0_8_ = uVar3;
      local_1f8._16_8_ = auStack_80._8_8_;
      auStack_80._8_8_ = uVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      (*(this->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo[0xc])
                ((QArrayDataPointer<char16_t> *)local_88,this,local_238);
      uVar4 = local_238._16_8_;
      uVar3 = local_238._8_8_;
      uVar2 = local_238._0_8_;
      local_238._0_8_ = local_88;
      local_238._8_8_ = auStack_80._0_8_;
      local_88 = (undefined1  [8])uVar2;
      auStack_80._0_8_ = uVar3;
      local_238._16_8_ = auStack_80._8_8_;
      auStack_80._8_8_ = uVar4;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      local_288.d = (Data *)0x0;
      local_288.ptr = (char16_t *)0x0;
      local_288.size = 0;
      if (cVar15 == '\x01') {
        auStack_80._16_8_ = local_218;
LAB_0017b780:
        auStack_80[8] = 0x20;
        local_88 = (undefined1  [8])0x21aaf1;
        auStack_80._0_8_ = (ProString *)local_1f8;
        ::operator+=((QString *)&local_288,
                     (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_QString_&>,_char>,_QString_&>
                      *)local_88);
        pQVar19 = pQVar14;
      }
      else {
        pQVar1 = (this->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
        bVar5 = ProString::operator==((ProString *)local_88,"lib");
        if (bVar5) {
          pQVar1 = (this->super_MakefileGenerator).project;
          QString::QString((QString *)local_108,"staticlib");
          bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_108,false);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_108);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
          if (bVar5) {
            auStack_80._16_8_ = local_238;
            goto LAB_0017b780;
          }
        }
        else {
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        }
        pQVar19 = pQVar14;
        if (cVar6 == '\0') {
          if (cVar15 == '\x02') {
            if ((pQVar14->d).size != 0) {
              QString::operator+=(pQVar14,"\n\t");
            }
            local_108._0_8_ = "\"`dirname ";
            local_108._8_8_ = local_238;
            local_108._16_8_ = "`\"";
            QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>::
            convertTo<QString>((QString *)local_c8,
                               (QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>
                                *)local_108);
            MakefileGenerator::mkdir_p_asstring
                      ((QString *)local_88,&pUVar16->super_MakefileGenerator,(QString *)local_c8,
                       false);
            QString::append((QString *)pQVar14);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8)
            ;
          }
          local_88 = (undefined1  [8])0x21c54e;
          auStack_80[8] = 0x20;
          auStack_80._16_8_ = local_238;
          auStack_80._0_8_ = (ProString *)local_1f8;
          ::operator+=((QString *)&local_288,
                       (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[21],_QString_&>,_char>,_QString_&>
                        *)local_88);
        }
      }
      pQVar1 = (pUVar16->super_MakefileGenerator).project;
      pUVar18 = pUVar16;
      ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
      QMakeEvaluator::first((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
      bVar5 = ProString::operator==((ProString *)local_88,"lib");
      if (bVar5) {
        pQVar1 = (pUVar16->super_MakefileGenerator).project;
        QString::QString(&file.m_string,"staticlib");
        bVar5 = QMakeProject::isActiveConfig(pQVar1,&file.m_string,false);
        if (bVar5) {
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&file);
          goto LAB_0017bae2;
        }
        pQVar1 = (pUVar16->super_MakefileGenerator).project;
        local_138._8_8_ = ".CONFIG";
        local_138._0_8_ = t;
        ProString::ProString<QString_const&,char_const(&)[8]>
                  ((ProString *)local_108,
                   (QStringBuilder<const_QString_&,_const_char_(&)[8]> *)local_138);
        pQVar9 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_108)->
                  super_QList<ProString>;
        qVar12 = QtPrivate::indexOf<ProString,char[10]>(pQVar9,(char (*) [10])"fix_rpath",0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_108);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&file);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        if (qVar12 == -1) goto LAB_0017bb01;
        if ((pQVar19->d).size != 0) {
          QString::operator+=(pQVar19,"\n\t");
        }
        pQVar1 = (pUVar16->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_88,"QMAKE_FIX_RPATH");
        bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        if (bVar5) {
          pQVar1 = (pUVar16->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_88,"QMAKE_LFLAGS_RPATH");
          bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          if (!bVar5) {
            ProKey::ProKey((ProKey *)&file,"QMAKE_LFLAGS_RPATH");
            (*(pUVar16->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
              [0x16])(&local_2c8,pUVar16,&file);
            local_2a8._24_8_ = local_2c8.size;
            local_2a8._16_8_ = local_2c8.ptr;
            local_2a8._8_8_ = local_2c8.d;
            local_2a8._0_8_ = "-$(LINK) $(LFLAGS) ";
            local_2c8.d = (Data *)0x0;
            local_2c8.ptr = (char16_t *)0x0;
            local_2c8.size = 0;
            QStringBuilder<const_char_(&)[20],_QString>::QStringBuilder
                      ((QStringBuilder<const_char_(&)[20],_QString> *)local_138,
                       (QStringBuilder<const_char_(&)[20],_QString> *)local_2a8);
            local_138._32_8_ = local_198;
            QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>::QStringBuilder
                      ((QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&> *)
                       local_108,
                       (QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&> *)
                       local_138);
            local_108._40_8_ = " -o ";
            QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>
            ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>
                              *)local_c8,
                             (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>
                              *)local_108);
            local_98 = (QString *)local_238;
            pUVar16 = pUVar18;
            QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>
            ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>
                              *)local_88,
                             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>
                              *)local_c8);
            local_50 = (QString *)0x21d754;
            pUVar18 = pUVar16;
            ::operator+=(pQVar19,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[20],_QString>,_QString_&>,_const_char_(&)[5]>,_QString_&>,_const_char_(&)[31]>
                                  *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)auStack_80);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_c8 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_108 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_138 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_2a8 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2c8);
            __return_storage_ptr__ = pQVar19;
            goto LAB_0017bf0f;
          }
          QString::append((QString *)pQVar19);
          __return_storage_ptr__ = pQVar19;
        }
        else {
          __return_storage_ptr__ = pQVar19;
          QString::append((QString *)pQVar19);
          ProKey::ProKey((ProKey *)&file,"QMAKE_FIX_RPATH");
          (*(pUVar16->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
            [0x16])(&local_2c8,pUVar16,&file);
          local_2a8._24_8_ = local_2c8.size;
          local_2a8._16_8_ = local_2c8.ptr;
          local_2a8._8_8_ = local_2c8.d;
          local_2a8._0_8_ = "\n\t-";
          local_2c8.d = (Data *)0x0;
          local_2c8.ptr = (char16_t *)0x0;
          local_2c8.size = 0;
          QStringBuilder<const_char_(&)[4],_QString>::QStringBuilder
                    ((QStringBuilder<const_char_(&)[4],_QString> *)local_138,
                     (QStringBuilder<const_char_(&)[4],_QString> *)local_2a8);
          local_138[0x20] = 0x20;
          QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>::QStringBuilder
                    ((QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char> *)local_108,
                     (QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char> *)local_138);
          local_108._40_8_ = (QString *)local_238;
          QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>
          ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>
                            *)local_c8,
                           (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>
                            *)local_108);
          local_98 = (QString *)CONCAT71(local_98._1_7_,0x20);
          pUVar16 = pUVar18;
          QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>
          ::QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>
                            *)local_88,
                           (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>
                            *)local_c8);
          pUVar18 = pUVar16;
          local_50 = (QString *)local_238;
          ::operator+=(pQVar19,(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[4],_QString>,_char>,_QString_&>,_char>,_QString_&>
                                *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)auStack_80)
          ;
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)(local_c8 + 8));
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)(local_108 + 8));
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)(local_138 + 8));
          QArrayDataPointer<char16_t>::~QArrayDataPointer
                    ((QArrayDataPointer<char16_t> *)(local_2a8 + 8));
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2c8);
LAB_0017bf0f:
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&file);
        }
      }
      else {
LAB_0017bae2:
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
LAB_0017bb01:
        __return_storage_ptr__ = pQVar19;
        if (local_288.size != 0) {
          if ((pQVar19->d).size != 0) {
            QString::operator+=(pQVar19,"\n\t");
          }
          QString::append((QString *)pQVar19);
        }
      }
      if (cVar6 == '\0') {
        pQVar1 = (pUVar16->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
        bVar5 = ProString::operator==((ProString *)local_88,"lib");
        if (bVar5) {
          pQVar1 = (pUVar16->super_MakefileGenerator).project;
          QString::QString((QString *)local_108,"staticlib");
          bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_108,false);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_108);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
          if (bVar5) {
            pQVar1 = (pUVar16->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)local_88,"QMAKE_RANLIB");
            bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            if (!bVar5) {
              QString::QString((QString *)local_c8,"\n\t$(RANLIB) ");
              auStack_80._8_8_ = local_c8._16_8_;
              auStack_80._0_8_ = local_c8._8_8_;
              local_88 = (undefined1  [8])local_c8._0_8_;
              local_c8._0_8_ = (ProString *)0x0;
              local_c8._8_8_ = (ProString *)0x0;
              local_c8._16_8_ = (ProString *)0x0;
              auStack_80._16_8_ = local_238;
              ::operator+=(__return_storage_ptr__,(QStringBuilder<QString,_QString_&> *)local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_c8);
            }
            goto LAB_0017c118;
          }
        }
        else {
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        }
        pQVar1 = (pUVar16->super_MakefileGenerator).project;
        QString::QString((QString *)local_c8,"debug_info");
        bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_c8,false);
        if (!bVar5) {
          pQVar1 = (pUVar16->super_MakefileGenerator).project;
          QString::QString((QString *)local_108,"nostrip");
          bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_108,false);
          if (!bVar5) {
            pQVar1 = (pUVar16->super_MakefileGenerator).project;
            ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIP");
            bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_108);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8)
            ;
            if (!bVar5) {
              QString::operator+=(__return_storage_ptr__,"\n\t-$(STRIP)");
              pQVar1 = (pUVar16->super_MakefileGenerator).project;
              ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
              QMakeEvaluator::first
                        ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
              bVar5 = ProString::operator==((ProString *)local_88,"lib");
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_c8);
              if (bVar5) {
                pQVar1 = (pUVar16->super_MakefileGenerator).project;
                ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIPFLAGS_LIB");
                bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_88);
                if (!bVar5) {
                  str = "QMAKE_STRIPFLAGS_LIB";
LAB_0017d49b:
                  ProKey::ProKey((ProKey *)local_88,str);
                  (*(pUVar16->super_MakefileGenerator).super_QMakeSourceFileInfo.
                    _vptr_QMakeSourceFileInfo[0x16])
                            ((QArrayDataPointer<char16_t> *)local_108,pUVar16,
                             (QArrayDataPointer<char16_t> *)local_88);
                  local_c8._24_8_ = local_108._16_8_;
                  local_c8._16_8_ = local_108._8_8_;
                  local_c8._8_8_ = local_108._0_8_;
                  local_c8._0_8_ = " ";
                  local_108._0_8_ = (ProString *)0x0;
                  local_108._8_8_ = (ProString *)0x0;
                  local_108._16_8_ = (ProString *)0x0;
                  ::operator+=(__return_storage_ptr__,
                               (QStringBuilder<const_char_(&)[2],_QString> *)local_c8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)(local_c8 + 8));
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_108);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_88);
                }
              }
              else {
                pQVar1 = (pUVar16->super_MakefileGenerator).project;
                ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
                QMakeEvaluator::first
                          ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
                bVar5 = ProString::operator==((ProString *)local_88,"app");
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_88);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_c8);
                if (bVar5) {
                  pQVar1 = (pUVar16->super_MakefileGenerator).project;
                  ProKey::ProKey((ProKey *)local_88,"QMAKE_STRIPFLAGS_APP");
                  bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_88);
                  if (!bVar5) {
                    str = "QMAKE_STRIPFLAGS_APP";
                    goto LAB_0017d49b;
                  }
                }
              }
              local_88[0] = 0x20;
              auStack_80._0_8_ = local_238;
              ::operator+=(__return_storage_ptr__,(QStringBuilder<char,_QString_&> *)local_88);
            }
            goto LAB_0017c118;
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_108);
        }
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
      }
LAB_0017c118:
      if ((this_00->d).size != 0) {
        ProString::ProString((ProString *)local_88,"\n\t");
        QList<ProString>::emplaceBack<ProString>(this_00,(ProString *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
      }
      if (cVar15 == '\x01') {
        local_c8._0_8_ = "-$(DEL_FILE) -r ";
        local_c8._8_8_ = local_218;
        ProString::ProString<char_const(&)[17],QString&>
                  ((ProString *)local_88,(QStringBuilder<const_char_(&)[17],_QString_&> *)local_c8);
        QList<ProString>::emplaceBack<ProString>(this_00,(ProString *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        pUVar16 = pUVar18;
      }
      else {
        if (cVar6 == '\0') {
          local_c8._0_8_ = "-$(DEL_FILE) ";
          local_c8._8_8_ = local_238;
          ProString::ProString<char_const(&)[14],QString&>
                    ((ProString *)local_88,(QStringBuilder<const_char_(&)[14],_QString_&> *)local_c8
                    );
          QList<ProString>::emplaceBack<ProString>(this_00,(ProString *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        }
        pUVar16 = pUVar18;
        if (cVar15 == '\x02') {
          pQVar1 = (pUVar18->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_c8,"DESTDIR");
          QMakeEvaluator::first
                    ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
          off = auStack_80._20_4_;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
          pQVar1 = (pUVar18->super_MakefileGenerator).project;
          ProKey::ProKey((ProKey *)local_88,"QMAKE_BUNDLED_FILES");
          pQVar9 = &QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_88)->
                    super_QList<ProString>;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
          this_01 = QList<ProString>::begin(pQVar9);
          iVar10 = QList<ProString>::end(pQVar9);
          for (; this_01.i != iVar10.i; this_01.i = this_01.i + 1) {
            file.m_file = -0x55555556;
            file._36_4_ = 0xaaaaaaaa;
            file.m_hash = 0xaaaaaaaaaaaaaaaa;
            file.m_string.d.size = -0x5555555555555556;
            file.m_offset = -0x55555556;
            file.m_length = -0x55555556;
            file.m_string.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
            file.m_string.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
            ProString::mid(&file,this_01.i,off,-1);
            local_2a8._16_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_2a8._0_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_2a8._8_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_138._0_8_ = local_198;
            local_138._8_8_ = &file;
            QStringBuilder<QString_&,_ProString_&>::convertTo<QString>
                      ((QString *)local_108,(QStringBuilder<QString_&,_ProString_&> *)local_138);
            pUVar18 = pUVar16;
            MakefileGenerator::fileFixify
                      ((QString *)local_c8,&pUVar16->super_MakefileGenerator,(QString *)local_108,
                       (FileFixifyTypes)0x4,true);
            MakefileGenerator::filePrefixRoot
                      ((QString *)local_88,&pUVar16->super_MakefileGenerator,(QString *)&local_158,
                       (QString *)local_c8);
            (*(pUVar16->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
              [0xc])(local_2a8,pUVar16,(QArrayDataPointer<char16_t> *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_108);
            pQVar14 = __return_storage_ptr__;
            if ((__return_storage_ptr__->d).size != 0) {
              QString::operator+=(__return_storage_ptr__,"\n\t");
            }
            local_138._0_8_ = "\"`dirname ";
            local_138._8_8_ = local_2a8;
            local_138._16_8_ = "`\"";
            QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>::
            convertTo<QString>((QString *)local_108,
                               (QStringBuilder<QStringBuilder<const_char_(&)[11],_QString_&>,_const_char_(&)[3]>
                                *)local_138);
            pUVar16 = pUVar18;
            MakefileGenerator::mkdir_p_asstring
                      ((QString *)local_c8,&pUVar18->super_MakefileGenerator,(QString *)local_108,
                       false);
            auStack_80._8_8_ = local_c8._16_8_;
            auStack_80._0_8_ = local_c8._8_8_;
            local_88 = (undefined1  [8])local_c8._0_8_;
            local_c8._0_8_ = (QString *)0x0;
            local_c8._8_8_ = (QString *)0x0;
            local_c8._16_8_ = (ProString *)0x0;
            auStack_80._16_8_ = "\n\t";
            ::operator+=(__return_storage_ptr__,
                         (QStringBuilder<QString,_const_char_(&)[3]> *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_108);
            local_88 = (undefined1  [8])0x21b481;
            auStack_80._0_8_ = local_2a8;
            auStack_80._8_8_ = "\n\t";
            ::operator+=(__return_storage_ptr__,
                         (QStringBuilder<QStringBuilder<const_char_(&)[14],_QString_&>,_const_char_(&)[3]>
                          *)local_88);
            MakefileGenerator::escapeFilePath
                      ((ProString *)local_138,&pUVar18->super_MakefileGenerator,this_01.i);
            local_108._0_8_ = "$(QINSTALL) ";
            ProString::ProString((ProString *)(local_108 + 8),(ProString *)local_138);
            QStringBuilder<const_char_(&)[13],_ProString>::QStringBuilder
                      ((QStringBuilder<const_char_(&)[13],_ProString> *)local_c8,
                       (QStringBuilder<const_char_(&)[13],_ProString> *)local_108);
            local_90 = (char (*) [2])0x21fe9e;
            QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>::
            QStringBuilder((QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>
                            *)local_88,
                           (QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>
                            *)local_c8);
            local_48 = (QString *)local_2a8;
            ::operator+=(__return_storage_ptr__,
                         (QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[13],_ProString>,_const_char_(&)[2]>,_QString_&>
                          *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)auStack_80);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_c8 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_108 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_138);
            __return_storage_ptr__ = pQVar14;
            if ((this_00->d).size != 0) {
              ProString::ProString((ProString *)local_88,"\n\t");
              QList<ProString>::emplaceBack<ProString>(this_00,(ProString *)local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
              __return_storage_ptr__ = pQVar14;
            }
            local_c8._0_8_ = "-$(DEL_FILE) ";
            local_c8._8_8_ = (ProString *)local_2a8;
            ProString::ProString<char_const(&)[14],QString&>
                      ((ProString *)local_88,
                       (QStringBuilder<const_char_(&)[14],_QString_&> *)local_c8);
            QList<ProString>::emplaceBack<ProString>(this_00,(ProString *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_2a8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&file);
          }
        }
      }
      if (local_1b8.size != 0) {
        lVar13 = 0;
        uVar8 = local_1b8.size;
        for (uVar17 = 0; uVar17 < uVar8; uVar17 = uVar17 + 1) {
          if ((pUVar16->super_MakefileGenerator).target_mode < TARG_WIN_MODE) {
            local_c8._16_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_c8._0_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_c8._8_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            pPVar11 = QList<ProString>::data((QList<ProString> *)&local_1b8);
            local_108._8_8_ = (long)&(pPVar11->m_string).d.d + lVar13;
            local_108._0_8_ = &local_178;
            QStringBuilder<QString_&,_ProString_&>::convertTo<QString>
                      ((QString *)local_88,(QStringBuilder<QString_&,_ProString_&> *)local_108);
            Option::fixPathToTargetOS((QString *)local_c8,(QString *)local_88,false,true);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            qVar12 = QString::lastIndexOf((QString *)local_c8,&Option::dir_sep,CaseSensitive);
            pUVar18 = pUVar16;
            if ((int)qVar12 != -1) {
              QString::right((QString *)local_88,(QString *)local_c8,
                             local_c8._16_8_ - (long)((int)qVar12 + 1));
              uVar4 = local_c8._16_8_;
              uVar3 = local_c8._8_8_;
              uVar2 = local_c8._0_8_;
              local_c8._0_8_ = local_88;
              local_c8._8_8_ = auStack_80._0_8_;
              local_88 = (undefined1  [8])uVar2;
              auStack_80._0_8_ = uVar3;
              local_c8._16_8_ = auStack_80._8_8_;
              auStack_80._8_8_ = uVar4;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
              pUVar18 = pUVar16;
            }
            local_108._16_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_108._0_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_108._8_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_2a8._0_8_ = local_198;
            local_2a8._8_8_ = (ProString *)local_c8;
            QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                      ((QString *)local_138,(QStringBuilder<QString_&,_QString_&> *)local_2a8);
            pUVar16 = pUVar18;
            MakefileGenerator::fileFixify
                      (&file.m_string,&pUVar18->super_MakefileGenerator,(QString *)local_138,
                       (FileFixifyTypes)0x4,true);
            MakefileGenerator::filePrefixRoot
                      ((QString *)local_88,&pUVar18->super_MakefileGenerator,(QString *)&local_158,
                       &file.m_string);
            (*(pUVar18->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
              [0xc])((ProString *)local_108,pUVar18,(ProString *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&file);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_138);
            local_88 = (undefined1  [8])0x21c5f9;
            auStack_80._0_8_ = (ProString *)local_108;
            ::operator+=(__return_storage_ptr__,
                         (QStringBuilder<const_char_(&)[25],_QString_&> *)local_88);
            if ((this_00->d).size != 0) {
              ProString::ProString((ProString *)local_88,"\n\t");
              QList<ProString>::emplaceBack<ProString>(this_00,(ProString *)local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
            }
            file.m_string.d.d = (Data *)0x21b481;
            file.m_string.d.ptr = (char16_t *)local_108;
            ProString::ProString<char_const(&)[14],QString&>
                      ((ProString *)local_88,(QStringBuilder<const_char_(&)[14],_QString_&> *)&file)
            ;
            QList<ProString>::emplaceBack<ProString>(this_00,(ProString *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_108);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8)
            ;
            uVar8 = local_1b8.size;
          }
          lVar13 = lVar13 + 0x30;
        }
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_238);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_218);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1f8);
      pQVar14 = __return_storage_ptr__;
      if (cVar6 == '\0') {
        pQVar1 = (pUVar16->super_MakefileGenerator).project;
        ProKey::ProKey((ProKey *)local_c8,"TEMPLATE");
        QMakeEvaluator::first
                  ((ProString *)local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_c8);
        bVar5 = ProString::operator==((ProString *)local_88,"lib");
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        pQVar14 = __return_storage_ptr__;
        if (bVar5) goto LAB_0017c924;
      }
      else {
LAB_0017c924:
        file.m_string.d.d = (Data *)0x0;
        file.m_string.d.ptr = (char16_t *)0x0;
        file.m_string.d.size = 0;
        QString::QString((QString *)local_88,"prl");
        QList<QString>::emplaceBack<QString>((QList<QString> *)&file,(QString *)local_88);
        QString::QString((QString *)local_c8,"libtool");
        QList<QString>::emplaceBack<QString>((QList<QString> *)&file,(QString *)local_c8);
        QString::QString((QString *)local_108,"pkgconfig");
        QList<QString>::emplaceBack<QString>((QList<QString> *)&file,(QString *)local_108);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_108);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88);
        lVar13 = 0x10;
        __return_storage_ptr__ = pQVar14;
        for (uVar8 = 0; uVar8 < (ulong)file.m_string.d.size; uVar8 = uVar8 + 1) {
          local_138._0_8_ = *(undefined8 *)((long)file.m_string.d.ptr + lVar13 + -0x10);
          local_138._8_8_ = *(undefined8 *)((long)file.m_string.d.ptr + lVar13 + -8);
          local_138._16_8_ = *(undefined8 *)((long)file.m_string.d.ptr + lVar13);
          if ((ProString *)local_138._0_8_ != (ProString *)0x0) {
            LOCK();
            *(int *)&(((ProString *)local_138._0_8_)->m_string).d.d =
                 *(int *)&(((ProString *)local_138._0_8_)->m_string).d.d + 1;
            UNLOCK();
          }
          local_2a8._0_8_ = (ProString *)0x0;
          local_2a8._8_8_ = (ProString *)0x0;
          local_2a8._16_8_ = (ProString *)0x0;
          bVar5 = comparesEqual((QString *)local_138,"prl");
          pUVar18 = pUVar16;
          if (bVar5) {
            pQVar1 = (pUVar16->super_MakefileGenerator).project;
            QString::QString((QString *)local_c8,"create_prl");
            bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_c8,false);
            pQVar14 = __return_storage_ptr__;
            if (bVar5) {
              pQVar1 = (pUVar16->super_MakefileGenerator).project;
              QString::QString((QString *)local_108,"no_install_prl");
              bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_108,false);
              if (!bVar5) {
                pQVar1 = (pUVar16->super_MakefileGenerator).project;
                ProKey::ProKey((ProKey *)local_88,"QMAKE_INTERNAL_PRL_FILE");
                bVar5 = QMakeProject::isEmpty(pQVar1,(ProKey *)local_88);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_88);
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_108);
                pQVar14 = __return_storage_ptr__;
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)local_c8);
                __return_storage_ptr__ = pQVar14;
                if (!bVar5) {
                  MakefileGenerator::prlFileName
                            ((QString *)local_88,&pUVar18->super_MakefileGenerator,false);
                  uVar4 = local_2a8._16_8_;
                  uVar3 = local_2a8._8_8_;
                  uVar2 = local_2a8._0_8_;
                  local_2a8._0_8_ = local_88;
                  local_2a8._8_8_ = auStack_80._0_8_;
                  local_88 = (undefined1  [8])uVar2;
                  auStack_80._0_8_ = uVar3;
                  local_2a8._16_8_ = auStack_80._8_8_;
                  auStack_80._8_8_ = uVar4;
                  QArrayDataPointer<char16_t>::~QArrayDataPointer
                            ((QArrayDataPointer<char16_t> *)local_88);
                }
                goto LAB_0017cae2;
              }
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_108);
              pQVar14 = __return_storage_ptr__;
            }
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8)
            ;
            __return_storage_ptr__ = pQVar14;
          }
LAB_0017cae2:
          bVar5 = comparesEqual((QString *)local_138,"libtool");
          pUVar16 = pUVar18;
          if (bVar5) {
            pQVar1 = (pUVar18->super_MakefileGenerator).project;
            QString::QString((QString *)local_88,"create_libtool");
            bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_88,false);
            pQVar14 = __return_storage_ptr__;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            pUVar16 = pUVar18;
            __return_storage_ptr__ = pQVar14;
            if (bVar5) {
              libtoolFileName((QString *)local_88,pUVar18,false);
              uVar4 = local_2a8._16_8_;
              uVar3 = local_2a8._8_8_;
              uVar2 = local_2a8._0_8_;
              local_2a8._0_8_ = local_88;
              local_2a8._8_8_ = auStack_80._0_8_;
              local_88 = (undefined1  [8])uVar2;
              auStack_80._0_8_ = uVar3;
              local_2a8._16_8_ = auStack_80._8_8_;
              auStack_80._8_8_ = uVar4;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
              pUVar16 = pUVar18;
            }
          }
          bVar5 = comparesEqual((QString *)local_138,"pkgconfig");
          if (bVar5) {
            pQVar1 = (pUVar16->super_MakefileGenerator).project;
            QString::QString((QString *)local_88,"create_pc");
            bVar5 = QMakeProject::isActiveConfig(pQVar1,(QString *)local_88,false);
            pQVar14 = __return_storage_ptr__;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            __return_storage_ptr__ = pQVar14;
            if (bVar5) {
              MakefileGenerator::pkgConfigFileName
                        ((QString *)local_88,&pUVar16->super_MakefileGenerator,false);
              uVar4 = local_2a8._16_8_;
              uVar3 = local_2a8._8_8_;
              uVar2 = local_2a8._0_8_;
              local_2a8._0_8_ = local_88;
              local_2a8._8_8_ = auStack_80._0_8_;
              local_88 = (undefined1  [8])uVar2;
              auStack_80._0_8_ = uVar3;
              local_2a8._16_8_ = auStack_80._8_8_;
              auStack_80._8_8_ = uVar4;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
            }
          }
          if ((ProString *)local_2a8._16_8_ != (ProString *)0x0) {
            local_1f8._0_8_ = local_2a8._0_8_;
            local_1f8._8_8_ = local_2a8._8_8_;
            local_1f8._16_8_ = local_2a8._16_8_;
            if ((ProString *)local_2a8._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_2a8._0_8_)->d).d =
                   *(int *)&(((QString *)local_2a8._0_8_)->d).d + 1;
              UNLOCK();
            }
            pUVar18 = pUVar16;
            if (local_178.size != 0) {
              local_108._0_8_ = &local_178;
              local_108._8_8_ = (ProString *)local_2a8;
              QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                        ((QString *)local_c8,(QStringBuilder<QString_&,_QString_&> *)local_108);
              Option::fixPathToTargetOS((QString *)local_88,(QString *)local_c8,false,true);
              uVar4 = local_1f8._16_8_;
              uVar3 = local_1f8._8_8_;
              uVar2 = local_1f8._0_8_;
              local_1f8._0_8_ = local_88;
              local_1f8._8_8_ = auStack_80._0_8_;
              local_88 = (undefined1  [8])uVar2;
              auStack_80._0_8_ = uVar3;
              local_1f8._16_8_ = auStack_80._8_8_;
              auStack_80._8_8_ = uVar4;
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_c8);
              pUVar18 = pUVar16;
            }
            local_218._16_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_218._0_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_218._8_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_108._0_8_ = local_198;
            local_108._8_8_ = (ProString *)local_2a8;
            QStringBuilder<QString_&,_QString_&>::convertTo<QString>
                      ((QString *)local_c8,(QStringBuilder<QString_&,_QString_&> *)local_108);
            pUVar16 = pUVar18;
            MakefileGenerator::fileFixify
                      ((QString *)local_88,&pUVar18->super_MakefileGenerator,(QString *)local_c8,
                       (FileFixifyTypes)0x4,true);
            MakefileGenerator::filePrefixRoot
                      ((QString *)local_218,&pUVar18->super_MakefileGenerator,(QString *)&local_158,
                       (QString *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_c8)
            ;
            if ((this_00->d).size != 0) {
              ProString::ProString((ProString *)local_88,"\n\t");
              QList<ProString>::emplaceBack<ProString>(this_00,(ProString *)local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
            }
            (*(pUVar16->super_MakefileGenerator).super_QMakeSourceFileInfo._vptr_QMakeSourceFileInfo
              [0xc])((QArrayDataPointer<char16_t> *)local_108,pUVar16,local_218);
            local_c8._24_8_ = local_108._16_8_;
            local_c8._16_8_ = local_108._8_8_;
            local_c8._8_8_ = local_108._0_8_;
            local_c8._0_8_ = "-$(DEL_FILE) ";
            local_108._0_8_ = (QString *)0x0;
            local_108._8_8_ = (ProString *)0x0;
            local_108._16_8_ = (char (*) [3])0x0;
            ProString::ProString<char_const(&)[14],QString>
                      ((ProString *)local_88,(QStringBuilder<const_char_(&)[14],_QString> *)local_c8
                      );
            QList<ProString>::emplaceBack<ProString>(this_00,(ProString *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_c8 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_108);
            local_238._16_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_238._0_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_238._8_8_ = (ProString *)0xaaaaaaaaaaaaaaaa;
            local_2e0.d = (Data *)local_218._0_8_;
            local_2e0.ptr = (char16_t *)local_218._8_8_;
            local_2e0.size = local_218._16_8_;
            if ((ProString *)local_218._0_8_ != (ProString *)0x0) {
              LOCK();
              *(int *)&(((QString *)local_218._0_8_)->d).d =
                   *(int *)&(((QString *)local_218._0_8_)->d).d + 1;
              UNLOCK();
            }
            file_00.d.d._7_1_ = cVar6;
            file_00.d.d._0_7_ = in_stack_fffffffffffffcd8;
            file_00.d.ptr = (char16_t *)pUVar16;
            file_00.d.size = (qsizetype)__return_storage_ptr__;
            MakefileGenerator::fileInfo((MakefileGenerator *)local_88,file_00);
            QFileInfo::path();
            QFileInfo::~QFileInfo((QFileInfo *)local_88);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2e0);
            if ((ProString *)local_238._16_8_ != (ProString *)0x0) {
              if ((pQVar14->d).size != 0) {
                QString::operator+=(pQVar14,"\n\t");
              }
              MakefileGenerator::mkdir_p_asstring
                        ((QString *)local_88,&pUVar16->super_MakefileGenerator,(QString *)local_238,
                         true);
              QString::append((QString *)pQVar14);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_88);
            }
            if ((pQVar14->d).size != 0) {
              QString::operator+=(pQVar14,"\n\t");
            }
            QString::toUpper_helper((QString *)&local_2c8);
            local_108._24_8_ = local_2c8.size;
            local_108._16_8_ = local_2c8.ptr;
            local_108._8_8_ = local_2c8.d;
            local_108._0_8_ = "QMAKE_";
            local_2c8.d = (Data *)0x0;
            local_2c8.ptr = (char16_t *)0x0;
            local_2c8.size = 0;
            QStringBuilder<const_char_(&)[7],_QString>::QStringBuilder
                      ((QStringBuilder<const_char_(&)[7],_QString> *)local_c8,
                       (QStringBuilder<const_char_(&)[7],_QString> *)local_108);
            local_c8._32_8_ = "_INSTALL_REPLACE";
            ProString::ProString<QStringBuilder<char_const(&)[7],QString>,char_const(&)[17]>
                      ((ProString *)local_88,
                       (QStringBuilder<QStringBuilder<const_char_(&)[7],_QString>,_const_char_(&)[17]>
                        *)local_c8);
            MakefileGenerator::installMetaFile
                      ((QString *)&local_288,&pUVar16->super_MakefileGenerator,(ProKey *)local_88,
                       (QString *)local_1f8,(QString *)local_218);
            QString::append((QString *)pQVar14);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_288);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_88)
            ;
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_c8 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)(local_108 + 8));
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2c8);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_238);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_218);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)local_1f8);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_2a8);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_138);
          lVar13 = lVar13 + 0x18;
        }
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&file);
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_1d8);
      QArrayDataPointer<ProString>::~QArrayDataPointer(&local_1b8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_198);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_178);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
      goto LAB_0017d1a9;
    }
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
LAB_0017d1a9:
  if (*(char **)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QString
UnixMakefileGenerator::defaultInstall(const QString &t)
{
    if(t != "target" || project->first("TEMPLATE") == "subdirs")
        return QString();

    enum { NoBundle, SolidBundle, SlicedBundle } bundle = NoBundle;
    bool isAux = (project->first("TEMPLATE") == "aux");
    const QString root = installRoot();
    ProStringList &uninst = project->values(ProKey(t + ".uninstall"));
    QString ret, destdir = project->first("DESTDIR").toQString();
    if(!destdir.isEmpty() && destdir.right(1) != Option::dir_sep)
        destdir += Option::dir_sep;
    QString targetdir = fileFixify(project->first("target.path").toQString(), FileFixifyAbsolute);
    if(targetdir.right(1) != Option::dir_sep)
        targetdir += Option::dir_sep;

    ProStringList links;
    QString target="$(TARGET)";
    const ProStringList &targets = project->values(ProKey(t + ".targets"));
    if(!project->isEmpty("QMAKE_BUNDLE")) {
        target = project->first("QMAKE_BUNDLE").toQString();
        bundle = project->isActiveConfig("sliced_bundle") ? SlicedBundle : SolidBundle;
    } else if(project->first("TEMPLATE") == "app") {
        target = "$(QMAKE_TARGET)";
    } else if(project->first("TEMPLATE") == "lib") {
            if (!project->isActiveConfig("staticlib")
                    && !project->isActiveConfig("plugin")
                    && !project->isActiveConfig("unversioned_libname")) {
                if(project->isEmpty("QMAKE_HPUX_SHLIB")) {
                    links << "$(TARGET0)" << "$(TARGET1)" << "$(TARGET2)";
                } else {
                    links << "$(TARGET0)";
                }
            }
    }
    for(int i = 0; i < targets.size(); ++i) {
        QString src = targets.at(i).toQString(),
                dst = escapeFilePath(filePrefixRoot(root, targetdir + src.section('/', -1)));
        if(!ret.isEmpty())
            ret += "\n\t";
        ret += "$(QINSTALL) " + escapeFilePath(Option::fixPathToTargetOS(src, false)) + ' ' + dst;
        if(!uninst.isEmpty())
            uninst.append("\n\t");
        uninst.append("-$(DEL_FILE) " + dst);
    }

    {
        QString src_targ = target;
        if(!destdir.isEmpty())
            src_targ = Option::fixPathToTargetOS(destdir + target, false);
        QString plain_targ = filePrefixRoot(root, fileFixify(targetdir + target, FileFixifyAbsolute));
        QString dst_targ = plain_targ;
        plain_targ = escapeFilePath(plain_targ);
        if (bundle != NoBundle) {
            QString suffix;
            if (project->first("TEMPLATE") == "lib") {
                if (!project->isActiveConfig("shallow_bundle"))
                    suffix += "/Versions/" + project->first("QMAKE_FRAMEWORK_VERSION");
                suffix += "/$(TARGET)";
            } else {
                suffix = "/" + project->first("QMAKE_BUNDLE_LOCATION") + "/$(QMAKE_TARGET)";
            }
            dst_targ += suffix;
            if (bundle == SolidBundle) {
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += "$(DEL_FILE) -r " + plain_targ + "\n\t";
            } else {
                src_targ += suffix;
            }
        }
        src_targ = escapeFilePath(src_targ);
        dst_targ = escapeFilePath(dst_targ);

        QString copy_cmd;
        if (bundle == SolidBundle) {
            copy_cmd += "$(QINSTALL) " + src_targ + ' ' + plain_targ;
        } else if (project->first("TEMPLATE") == "lib" && project->isActiveConfig("staticlib")) {
            copy_cmd += "$(QINSTALL) " + src_targ + ' ' + dst_targ;
        } else if (!isAux) {
            if (bundle == SlicedBundle) {
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += mkdir_p_asstring("\"`dirname " + dst_targ + "`\"", false);
            }
            copy_cmd += "$(QINSTALL_PROGRAM) " + src_targ + ' ' + dst_targ;
        }
        if(project->first("TEMPLATE") == "lib" && !project->isActiveConfig("staticlib")
           && project->values(ProKey(t + ".CONFIG")).indexOf("fix_rpath") != -1) {
            if (!ret.isEmpty())
                ret += "\n\t";
            if(!project->isEmpty("QMAKE_FIX_RPATH")) {
                ret += copy_cmd;
                ret += "\n\t-" + var("QMAKE_FIX_RPATH") + ' ' + dst_targ + ' ' + dst_targ;
            } else if(!project->isEmpty("QMAKE_LFLAGS_RPATH")) {
                ret += "-$(LINK) $(LFLAGS) " + var("QMAKE_LFLAGS_RPATH") + targetdir + " -o " +
                       dst_targ + " $(OBJECTS) $(LIBS) $(OBJCOMP)";
            } else {
                ret += copy_cmd;
            }
        } else if (!copy_cmd.isEmpty()) {
            if (!ret.isEmpty())
                ret += "\n\t";
            ret += copy_cmd;
        }

        if (isAux) {
        } else if (project->first("TEMPLATE") == "lib" && project->isActiveConfig("staticlib")) {
            if(!project->isEmpty("QMAKE_RANLIB"))
                ret += QString("\n\t$(RANLIB) ") + dst_targ;
        } else if (!project->isActiveConfig("debug_info") && !project->isActiveConfig("nostrip")
                   && !project->isEmpty("QMAKE_STRIP")) {
            ret += "\n\t-$(STRIP)";
            if (project->first("TEMPLATE") == "lib") {
                if (!project->isEmpty("QMAKE_STRIPFLAGS_LIB"))
                    ret += " " + var("QMAKE_STRIPFLAGS_LIB");
            } else if (project->first("TEMPLATE") == "app") {
                if (!project->isEmpty("QMAKE_STRIPFLAGS_APP"))
                    ret += " " + var("QMAKE_STRIPFLAGS_APP");
            }
            ret += ' ' + dst_targ;
        }
        if(!uninst.isEmpty())
            uninst.append("\n\t");
        if (bundle == SolidBundle)
            uninst.append("-$(DEL_FILE) -r " + plain_targ);
        else if (!isAux)
            uninst.append("-$(DEL_FILE) " + dst_targ);
        if (bundle == SlicedBundle) {
            int dstlen = project->first("DESTDIR").length();
            for (const ProString &src : project->values("QMAKE_BUNDLED_FILES")) {
                ProString file = src.mid(dstlen);
                QString dst = escapeFilePath(
                            filePrefixRoot(root, fileFixify(targetdir + file, FileFixifyAbsolute)));
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += mkdir_p_asstring("\"`dirname " + dst + "`\"", false) + "\n\t";
                ret += "-$(DEL_FILE) " + dst + "\n\t"; // Can't overwrite symlinks to directories
                ret += "$(QINSTALL) " + escapeFilePath(src) + " " + dst;
                if (!uninst.isEmpty())
                    uninst.append("\n\t");
                uninst.append("-$(DEL_FILE) " + dst);
            }
        }
        if(!links.isEmpty()) {
            for(int i = 0; i < links.size(); ++i) {
                if (target_mode == TARG_UNIX_MODE || target_mode == TARG_MAC_MODE) {
                    QString link = Option::fixPathToTargetOS(destdir + links[i], false);
                    int lslash = link.lastIndexOf(Option::dir_sep);
                    if(lslash != -1)
                        link = link.right(link.size() - (lslash + 1));
                    QString dst_link = escapeFilePath(
                                filePrefixRoot(root, fileFixify(targetdir + link, FileFixifyAbsolute)));
                    ret += "\n\t-$(SYMLINK) $(TARGET) " + dst_link;
                    if(!uninst.isEmpty())
                        uninst.append("\n\t");
                    uninst.append("-$(DEL_FILE) " + dst_link);
                }
            }
        }
    }
    if (isAux || project->first("TEMPLATE") == "lib") {
        QStringList types;
        types << "prl" << "libtool" << "pkgconfig";
        for(int i = 0; i < types.size(); ++i) {
            const QString type = types.at(i);
            QString meta;
            if(type == "prl" && project->isActiveConfig("create_prl") && !project->isActiveConfig("no_install_prl") &&
               !project->isEmpty("QMAKE_INTERNAL_PRL_FILE"))
                meta = prlFileName(false);
            if (type == "libtool" && project->isActiveConfig("create_libtool"))
                meta = libtoolFileName(false);
            if(type == "pkgconfig" && project->isActiveConfig("create_pc"))
                meta = pkgConfigFileName(false);
            if(!meta.isEmpty()) {
                QString src_meta = meta;
                if(!destdir.isEmpty())
                    src_meta = Option::fixPathToTargetOS(destdir + meta, false);
                QString dst_meta = filePrefixRoot(root, fileFixify(targetdir + meta, FileFixifyAbsolute));
                if(!uninst.isEmpty())
                    uninst.append("\n\t");
                uninst.append("-$(DEL_FILE) " + escapeFilePath(dst_meta));
                const QString dst_meta_dir = fileInfo(dst_meta).path();
                if(!dst_meta_dir.isEmpty()) {
                    if(!ret.isEmpty())
                        ret += "\n\t";
                    ret += mkdir_p_asstring(dst_meta_dir, true);
                }
                if (!ret.isEmpty())
                    ret += "\n\t";
                ret += installMetaFile(ProKey("QMAKE_" + type.toUpper() + "_INSTALL_REPLACE"), src_meta, dst_meta);
            }
        }
    }
    return ret;
}